

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O1

BaseState<false> * __thiscall
MultiState<false>::StartObject(MultiState<false> *this,Context<false> *ctx)

{
  example *peVar1;
  
  peVar1 = (*ctx->example_factory)(ctx->example_factory_context);
  ctx->ex = peVar1;
  (*(ctx->all->p->lp).default_label)(&peVar1->l);
  v_array<example_*>::push_back(ctx->examples,&ctx->ex);
  Context<false>::PushNamespace(ctx," ",&this->super_BaseState<false>);
  return &(ctx->default_state).super_BaseState<false>;
}

Assistant:

BaseState<audit>* StartObject(Context<audit>& ctx)
  {
    // allocate new example
    ctx.ex = &(*ctx.example_factory)(ctx.example_factory_context);
    ctx.all->p->lp.default_label(&ctx.ex->l);
    ctx.examples->push_back(ctx.ex);

    // setup default namespace
    ctx.PushNamespace(" ", this);

    return &ctx.default_state;
  }